

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O3

int plugin_manager_clear(plugin_manager manager,plugin p)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  
  if (p == (plugin)0x0) {
    iVar3 = 1;
  }
  else {
    pcVar1 = plugin_name(p);
    lVar2 = set_get(manager->plugins,pcVar1);
    iVar3 = 0;
    if (lVar2 != 0) {
      lVar2 = set_remove(manager->plugins,pcVar1);
      iVar3 = 0;
      if (lVar2 == 0) {
        log_write_impl_va("metacall",0x116,"plugin_manager_unregister",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                          ,3,"Failed to unregister plugin %s from manager %s",pcVar1,manager->name);
        iVar3 = 1;
      }
    }
    plugin_destroy(p);
  }
  return iVar3;
}

Assistant:

int plugin_manager_clear(plugin_manager manager, plugin p)
{
	if (p == NULL)
	{
		return 1;
	}

	/* Remove the plugin from the plugins set */
	int result = plugin_manager_unregister(manager, p);

	/* Unload the dynamic link library and destroy the plugin */
	plugin_destroy(p);

	return result;
}